

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O3

KHashMapEntry * KHashMap_getentry(KonohaContext *kctx,KHashMap *kmap,kuint_t hcode)

{
  KHashMapEntry *pKVar1;
  
  pKVar1 = kmap->hentry[hcode % kmap->hmax];
  while( true ) {
    if (pKVar1 == (KHashMapEntry *)0x0) {
      return (KHashMapEntry *)0x0;
    }
    if (pKVar1->hcode == hcode) break;
    pKVar1 = pKVar1->next;
  }
  return pKVar1;
}

Assistant:

static KHashMapEntry *KHashMap_getentry(KonohaContext *kctx, KHashMap* kmap, kuint_t hcode)
{
	KHashMapEntry **hlist = kmap->hentry;
	size_t idx = hcode % kmap->hmax;
	KHashMapEntry *e = hlist[idx];
	while(e != NULL) {
		if(e->hcode == hcode) return e;
		e = e->next;
	}
	return NULL;
}